

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  uint id;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  basic_string_view<char> id_00;
  byte *local_20;
  
  bVar1 = *begin;
  pbVar4 = (byte *)begin;
  local_20 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>_&,_char>
    ::operator()(handler);
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    id = parse_nonnegative_int<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>>&,char>&>
                   ((char **)&local_20,end,handler);
    if ((local_20 == (byte *)end) || ((*local_20 != 0x3a && (*local_20 != 0x7d)))) {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>_&,_char>
      ::on_error(handler,"invalid format string");
      pbVar4 = local_20;
    }
    else {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>_&,_char>
      ::operator()(handler,id);
      pbVar4 = local_20;
    }
  }
  else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
    pbVar3 = (byte *)(begin + 1);
    do {
      pbVar2 = pbVar3;
      pbVar4 = (byte *)end;
      if (pbVar2 == (byte *)end) break;
      bVar1 = *pbVar2;
      pbVar3 = pbVar2 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar4 = pbVar2, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    id_00.size_ = (long)pbVar4 - (long)begin;
    id_00.data_ = begin;
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>_&,_char>
    ::operator()(handler,id_00);
  }
  else {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>_&,_char>
    ::on_error(handler,"invalid format string");
  }
  return (char *)pbVar4;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}